

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O3

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
env_infrastructure_t
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this,environment_t *env,timer_manager_factory_t *timer_factory,
          error_logger_shptr_t *error_logger,coop_listener_unique_ptr_t *coop_listener,
          mbox_t *stats_distribution_mbox)

{
  atomic_refcounted_t *paVar1;
  environment_t *env_00;
  mbox_t local_a0;
  mbox_t local_98;
  _Head_base<0UL,_so_5::coop_listener_t_*,_false> local_90;
  actual_elapsed_timers_collector_t *local_88;
  timer_manager_unique_ptr_t *local_80;
  outliving_reference_t<so_5::timer_manager_t::elapsed_timers_collector_t> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  demands_container_t *local_60;
  final_dereg_coop_container_t *local_58;
  condition_variable *local_50;
  actual_elapsed_timers_collector_t *local_48;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  local_40;
  outliving_reference_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t> local_38
  ;
  
  environment_infrastructure_t::environment_infrastructure_t
            (&this->super_environment_infrastructure_t);
  local_50 = &(this->m_sync_objects).m_wakeup_condition;
  (this->super_environment_infrastructure_t)._vptr_environment_infrastructure_t =
       (_func_int **)&PTR__env_infrastructure_t_00286d20;
  this->m_env = env;
  (this->m_sync_objects).m_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_sync_objects).m_lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_sync_objects).m_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_sync_objects).m_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_sync_objects).m_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(local_50);
  (this->m_sync_objects).m_status = working;
  local_58 = &this->m_final_dereg_coops;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_final_dereg_coops).super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::_M_initialize_map
            (&local_58->super__Deque_base<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>,0);
  this->m_shutdown_status = not_started;
  local_88 = &this->m_timers_collector;
  timer_manager_t::elapsed_timers_collector_t::elapsed_timers_collector_t
            (&local_88->super_elapsed_timers_collector_t);
  local_60 = &(this->m_timers_collector).m_demands;
  (this->m_timers_collector).super_elapsed_timers_collector_t._vptr_elapsed_timers_collector_t =
       (_func_int **)&PTR__actual_elapsed_timers_collector_t_00286dc8;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_timers_collector).m_demands.
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ::_M_initialize_map(&local_60->
                       super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
                      ,0);
  local_78.m_ptr =
       (elapsed_timers_collector_t *)
       (error_logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Stack_70 = (error_logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
  (error_logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (error_logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_48 = local_88;
  if ((timer_factory->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_80 = &this->m_timer_manager;
    (*timer_factory->_M_invoker)
              ((_Any_data *)local_80,(shared_ptr<so_5::error_logger_t> *)timer_factory,&local_78);
    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
    }
    event_queue_impl_t::event_queue_impl_t(&this->m_event_queue,&this->m_sync_objects);
    local_90._M_head_impl =
         (coop_listener->_M_t).
         super___uniq_ptr_impl<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>.
         _M_t.
         super__Tuple_impl<0UL,_so_5::coop_listener_t_*,_std::default_delete<so_5::coop_listener_t>_>
         .super__Head_base<0UL,_so_5::coop_listener_t_*,_false>._M_head_impl;
    (coop_listener->_M_t).
    super___uniq_ptr_impl<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>._M_t.
    super__Tuple_impl<0UL,_so_5::coop_listener_t_*,_std::default_delete<so_5::coop_listener_t>_>.
    super__Head_base<0UL,_so_5::coop_listener_t_*,_false>._M_head_impl = (coop_listener_t *)0x0;
    st_reusable_stuff::coop_repo_t::coop_repo_t
              (&this->m_coop_repo,env,(coop_listener_unique_ptr_t *)&local_90);
    if (local_90._M_head_impl != (coop_listener_t *)0x0) {
      (*(local_90._M_head_impl)->_vptr_coop_listener_t[1])();
    }
    local_40.m_ptr = &this->m_activity_tracker;
    local_90._M_head_impl = (coop_listener_t *)0x0;
    (this->m_activity_tracker).m_waiting.m_is_in_working = false;
    (this->m_activity_tracker).m_working.m_work_started_at.__d.__r = 0;
    (this->m_activity_tracker).m_working.m_work_activity.m_count = 0;
    (this->m_activity_tracker).m_working.m_work_activity.m_total_time.__r = 0;
    (this->m_activity_tracker).m_working.m_work_activity.m_avg_time.__r = 0;
    (this->m_activity_tracker).m_waiting.m_work_started_at.__d.__r = 0;
    (this->m_activity_tracker).m_waiting.m_work_activity.m_count = 0;
    (this->m_activity_tracker).m_waiting.m_work_activity.m_total_time.__r = 0;
    (this->m_activity_tracker).m_waiting.m_work_activity.m_avg_time.__r = 0;
    (this->m_activity_tracker).m_working.m_is_in_working = false;
    local_38.m_ptr = &this->m_event_queue;
    st_reusable_stuff::
    default_disp_impl_t<so_5::env_infrastructures::simple_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_mtsafe::impl::disp_ds_name_parts_t>
    ::default_disp_impl_t(&this->m_default_disp,&local_38,&local_40);
    env_00 = this->m_env;
    local_98 = (mbox_t)stats_distribution_mbox->m_obj;
    stats_distribution_mbox->m_obj = (abstract_message_box_t *)0x0;
    stats::impl::st_env_stuff::next_turn_mbox_t::make();
    st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>::stats_controller_t
              (&this->m_stats_controller,env_00,&local_98,&local_a0);
    if (local_a0.m_obj != (abstract_message_box_t *)0x0) {
      LOCK();
      paVar1 = &(local_a0.m_obj)->super_atomic_refcounted_t;
      (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
           (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
         (local_a0.m_obj != (abstract_message_box_t *)0x0)) {
        (*(local_a0.m_obj)->_vptr_abstract_message_box_t[1])();
      }
      local_a0.m_obj = (abstract_message_box_t *)0x0;
    }
    if (local_98.m_obj != (abstract_message_box_t *)0x0) {
      LOCK();
      paVar1 = &(local_98.m_obj)->super_atomic_refcounted_t;
      (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
           (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
         (local_98.m_obj != (abstract_message_box_t *)0x0)) {
        (*(local_98.m_obj)->_vptr_abstract_message_box_t[1])();
      }
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

env_infrastructure_t< ACTIVITY_TRACKER >::env_infrastructure_t(
	environment_t & env,
	timer_manager_factory_t timer_factory,
	error_logger_shptr_t error_logger,
	coop_listener_unique_ptr_t coop_listener,
	mbox_t stats_distribution_mbox )
	:	m_env( env )
	,	m_timer_manager(
			timer_factory(
				std::move(error_logger),
				outliving_mutable(m_timers_collector) ) )
	,	m_event_queue( m_sync_objects )
	,	m_coop_repo( env, std::move(coop_listener) )
	,	m_default_disp(
			outliving_mutable(m_event_queue),
			outliving_mutable(m_activity_tracker) )
	,	m_stats_controller(
			m_env,
			std::move(stats_distribution_mbox),
			stats::impl::st_env_stuff::next_turn_mbox_t::make() )
	{}